

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall booster::log::sinks::file::shift(file *this,string *base)

{
  char *pcVar1;
  char *pcVar2;
  long in_RDI;
  uint file;
  int in_stack_000000fc;
  string *in_stack_00000100;
  file *in_stack_00000108;
  string local_a8 [48];
  string local_78 [32];
  string local_58 [36];
  int local_34;
  string local_30 [48];
  
  format_file(in_stack_00000108,in_stack_00000100,in_stack_000000fc);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  remove(pcVar1);
  std::__cxx11::string::~string(local_30);
  local_34 = *(int *)(in_RDI + 8);
  while (local_34 = local_34 + -1, local_34 != 0) {
    format_file(in_stack_00000108,in_stack_00000100,in_stack_000000fc);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    format_file(in_stack_00000108,in_stack_00000100,in_stack_000000fc);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    rename(pcVar1,pcVar2);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
  }
  pcVar1 = (char *)std::__cxx11::string::c_str();
  format_file(in_stack_00000108,in_stack_00000100,in_stack_000000fc);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rename(pcVar1,pcVar2);
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

void file::shift(std::string const &base)
		{
			booster::nowide::remove(format_file(base,max_files_).c_str());
			for(unsigned file = max_files_-1;file > 0 ; file --) {
				booster::nowide::rename(format_file(base,file).c_str(),format_file(base,file+1).c_str());
			}
			
			booster::nowide::rename(base.c_str(),format_file(base,1).c_str());
		}